

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O1

string * ParseGroupFromPath(string *__return_storage_ptr__,string *file)

{
  char cVar1;
  long lVar2;
  size_type sVar3;
  long *plVar4;
  undefined8 *puVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int iVar7;
  size_type *psVar8;
  long *plVar9;
  size_type *psVar10;
  string extension;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 *local_60;
  char *local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,anon_var_dwarf_d14d39 + 9);
  lVar2 = std::__cxx11::string::find((char *)file,0x4f85ea,0);
  if (lVar2 != -1) {
    std::__cxx11::string::_M_replace((ulong)&local_60,0,local_58,0x4f85e6);
  }
  lVar2 = std::__cxx11::string::find((char *)file,0x4f85f5,0);
  if (lVar2 == -1) {
    sVar3 = file->_M_string_length;
    if (sVar3 == 0) {
      iVar7 = -1;
    }
    else {
      iVar7 = -1;
      do {
        cVar1 = (file->_M_dataplus)._M_p[sVar3 - 1];
        if ((cVar1 == '\\') || (cVar1 == '/')) {
          if (iVar7 != -1) {
            std::__cxx11::string::substr((ulong)local_40,(ulong)file);
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x4f8d49);
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            psVar8 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_80.field_2._M_allocated_capacity = *psVar8;
              local_80.field_2._8_8_ = puVar5[3];
            }
            else {
              local_80.field_2._M_allocated_capacity = *psVar8;
              local_80._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_80._M_string_length = puVar5[1];
            *puVar5 = psVar8;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
            local_a0 = &local_90;
            plVar4 = puVar5 + 2;
            if ((long *)*puVar5 == plVar4) {
              local_90 = *plVar4;
              lStack_88 = puVar5[3];
            }
            else {
              local_90 = *plVar4;
              local_a0 = (long *)*puVar5;
            }
            local_98 = puVar5[1];
            *puVar5 = plVar4;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60);
            goto LAB_0047826f;
          }
          iVar7 = (int)sVar3 + -1;
        }
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
    }
    if (iVar7 == -1) {
      std::operator+(&local_80,"[",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      plVar9 = plVar4 + 2;
      if ((long *)*plVar4 == plVar9) {
        local_90 = *plVar9;
        lStack_88 = plVar4[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *plVar9;
        local_a0 = (long *)*plVar4;
      }
      local_98 = plVar4[1];
      *plVar4 = (long)plVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar10 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar10) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      paVar6 = &local_80.field_2;
    }
    else {
      std::__cxx11::string::substr((ulong)local_40,(ulong)file);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x4f8d49);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_80.field_2._M_allocated_capacity = *psVar8;
        local_80.field_2._8_8_ = plVar4[3];
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar8;
        local_80._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_80._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
      local_a0 = &local_90;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_90 = *plVar4;
        lStack_88 = puVar5[3];
      }
      else {
        local_90 = *plVar4;
        local_a0 = (long *)*puVar5;
      }
      local_98 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60);
LAB_0047826f:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar10 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar10) {
        lVar2 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      paVar6 = &local_30;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar6->_M_allocated_capacity)[-2] != paVar6) {
      operator_delete((undefined1 *)(&paVar6->_M_allocated_capacity)[-2]);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"[coverage][.]","");
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ParseGroupFromPath(string file) {
	string extension = "";
	if (file.find(".test_slow") != std::string::npos) {
		// "slow" in the name indicates a slow test (i.e. only run as part of allunit)
		extension = "[.]";
	}
	if (file.find(".test_coverage") != std::string::npos) {
		// "coverage" in the name indicates a coverage test (i.e. only run as part of coverage)
		return "[coverage][.]";
	}
	// move backwards to the last slash
	int group_begin = -1, group_end = -1;
	for (idx_t i = file.size(); i > 0; i--) {
		if (file[i - 1] == '/' || file[i - 1] == '\\') {
			if (group_end == -1) {
				group_end = i - 1;
			} else {
				group_begin = i;
				return "[" + file.substr(group_begin, group_end - group_begin) + "]" + extension;
			}
		}
	}
	if (group_end == -1) {
		return "[" + file + "]" + extension;
	}
	return "[" + file.substr(0, group_end) + "]" + extension;
}